

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.c
# Opt level: O3

int bip32_key_get_fingerprint(ext_key *hdkey,uchar *bytes_out,size_t len)

{
  ulong uVar1;
  _Bool _Var2;
  ulong uVar3;
  int iVar4;
  
  iVar4 = -2;
  if (hdkey != (ext_key *)0x0) {
    _Var2 = key_is_valid(hdkey);
    if (((len == 4) && (bytes_out != (uchar *)0x0)) && (_Var2)) {
      if (hdkey->hash160[0] == '\0') {
        uVar1 = 0;
        do {
          uVar3 = uVar1;
          if (uVar3 == 0x13) goto LAB_0015a084;
          uVar1 = uVar3 + 1;
        } while (hdkey->hash160[uVar3 + 1] == '\0');
        if (0x12 < uVar3) {
LAB_0015a084:
          wally_hash160(hdkey->pub_key,0x21,hdkey->hash160,0x14);
        }
      }
      *(undefined4 *)bytes_out = *(undefined4 *)hdkey->hash160;
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int bip32_key_get_fingerprint(struct ext_key *hdkey,
                              unsigned char *bytes_out, size_t len)
{
    /* Validate our arguments and then the input key */
    if (!hdkey ||
        !key_is_valid(hdkey) ||
        !bytes_out || len != BIP32_KEY_FINGERPRINT_LEN)
        return WALLY_EINVAL;

    /* Derive hash160 if needed. */
    if (mem_is_zero(hdkey->hash160, sizeof(hdkey->hash160))) {
        key_compute_hash160(hdkey);
    }

    /* Fingerprint is first 32 bits of the key hash. */
    memcpy(bytes_out, hdkey->hash160, BIP32_KEY_FINGERPRINT_LEN);
    return WALLY_OK;
}